

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

uint8_t * duckdb_brotli::BrotliDecoderTakeOutput(BrotliDecoderStateInternal *s,size_t *size)

{
  long lVar1;
  BrotliDecoderErrorCode e;
  BrotliDecoderStateInternal *in_RSI;
  BrotliDecoderStateInternal *in_RDI;
  BrotliDecoderErrorCode status;
  size_t requested_out;
  size_t available_out;
  uint8_t *result;
  uint8_t **local_40;
  int in_stack_ffffffffffffffcc;
  uint8_t **next_out;
  size_t *local_8;
  
  local_8 = (size_t *)0x0;
  lVar1._0_4_ = in_RSI->state;
  lVar1._4_4_ = in_RSI->loop_counter;
  if (lVar1 == 0) {
    local_40 = (uint8_t **)0x1000000;
  }
  else {
    local_40 = *(uint8_t ***)in_RSI;
  }
  if ((in_RDI->ringbuffer == (uint8_t *)0x0) || (in_RDI->error_code < 0)) {
    in_RSI->state = BROTLI_STATE_UNINITED;
    in_RSI->loop_counter = 0;
    local_8 = (size_t *)0x0;
  }
  else {
    next_out = local_40;
    WrapRingBuffer((BrotliDecoderStateInternal *)0x841132);
    e = WriteRingBuffer(in_RSI,local_8,next_out,(size_t *)local_40,in_stack_ffffffffffffffcc);
    if ((e == BROTLI_DECODER_SUCCESS) || (e == BROTLI_DECODER_NEEDS_MORE_OUTPUT)) {
      *(long *)in_RSI = (long)local_40 - (long)next_out;
    }
    else {
      if (e < BROTLI_DECODER_NO_ERROR) {
        SaveErrorCode(in_RDI,e,0);
      }
      in_RSI->state = BROTLI_STATE_UNINITED;
      in_RSI->loop_counter = 0;
      local_8 = (size_t *)0x0;
    }
  }
  return (uint8_t *)local_8;
}

Assistant:

const uint8_t *BrotliDecoderTakeOutput(BrotliDecoderState *s, size_t *size) {
	uint8_t *result = 0;
	size_t available_out = *size ? *size : 1u << 24;
	size_t requested_out = available_out;
	BrotliDecoderErrorCode status;
	if ((s->ringbuffer == 0) || ((int)s->error_code < 0)) {
		*size = 0;
		return 0;
	}
	WrapRingBuffer(s);
	status = WriteRingBuffer(s, &available_out, &result, 0, BROTLI_TRUE);
	/* Either WriteRingBuffer returns those "success" codes... */
	if (status == BROTLI_DECODER_SUCCESS || status == BROTLI_DECODER_NEEDS_MORE_OUTPUT) {
		*size = requested_out - available_out;
	} else {
		/* ... or stream is broken. Normally this should be caught by
		   BrotliDecoderDecompressStream, this is just a safeguard. */
		if ((int)status < 0)
			SaveErrorCode(s, status, 0);
		*size = 0;
		result = 0;
	}
	return result;
}